

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  int iVar1;
  uint uVar2;
  ma_result mVar3;
  int iVar4;
  ulong uVar5;
  char cVar6;
  ma_uint32 i;
  uint uVar7;
  bool bVar8;
  
  mVar3 = MA_INVALID_ARGS;
  if (pSlot != (ma_uint64 *)0x0 && pAllocator != (ma_slot_allocator *)0x0) {
    iVar4 = 0;
    do {
      uVar2 = pAllocator->capacity;
      if ((uVar2 & 0x1f) != 0 || uVar2 >> 5 != 0) {
        uVar5 = 0;
        do {
          do {
            uVar2 = pAllocator->pGroups[uVar5].bitfield;
            uVar7 = 0;
            if (uVar2 == 0xffffffff) {
              iVar1 = 8;
            }
            else {
              do {
                if ((uVar2 >> (uVar7 & 0x1f) & 1) == 0) goto LAB_0010c4af;
                uVar7 = uVar7 + 1;
              } while (uVar7 != 0x20);
              uVar7 = 0x20;
LAB_0010c4af:
              if (0x1f < uVar7) {
                __assert_fail("bitOffset < 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                              ,0x435a,
                              "ma_result ma_slot_allocator_alloc(ma_slot_allocator *, ma_uint64 *)")
                ;
              }
              LOCK();
              bVar8 = uVar2 == pAllocator->pGroups[uVar5].bitfield;
              if (bVar8) {
                pAllocator->pGroups[uVar5].bitfield = uVar2 | 1 << (uVar7 & 0x1f);
              }
              UNLOCK();
              if (bVar8) {
                LOCK();
                pAllocator->count = pAllocator->count + 1;
                UNLOCK();
                uVar7 = uVar7 | (int)uVar5 << 5;
                iVar1 = 1;
                mVar3 = MA_SUCCESS;
                if (uVar7 < pAllocator->capacity) {
                  pAllocator->pSlots[uVar7] = pAllocator->pSlots[uVar7] + 1;
                  *pSlot = CONCAT44(pAllocator->pSlots[uVar7],uVar7);
                }
                else {
                  mVar3 = MA_OUT_OF_MEMORY;
                }
                uVar7 = 0;
              }
              else {
                iVar1 = 0;
                uVar7 = 1;
              }
            }
            cVar6 = (char)uVar7;
          } while (iVar1 == 0);
          if (iVar1 != 8) goto LAB_0010c55a;
          uVar5 = uVar5 + 1;
          uVar2 = pAllocator->capacity;
        } while (uVar5 < ((uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0));
      }
      if (pAllocator->count < uVar2) {
        cVar6 = '\x01';
      }
      else {
        mVar3 = MA_OUT_OF_MEMORY;
        cVar6 = '\0';
      }
LAB_0010c55a:
      if (cVar6 == '\0') {
        return mVar3;
      }
      bVar8 = iVar4 == 0;
      iVar4 = iVar4 + 1;
    } while (bVar8);
    mVar3 = MA_OUT_OF_MEMORY;
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    ma_atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}